

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O1

void display_blow_message_vs_player(blow_method *method,char *m_name,player *p,wchar_t damage)

{
  _Bool _Var1;
  char *s;
  char *pcVar2;
  
  s = monster_blow_method_action(method,L'\xffffffff');
  if (s == (char *)0x0) {
    if ((L'\0' < damage) && ((p->opts).opt[3] == true)) {
      msgt(method->msgt,"You take %d damage.",(ulong)(uint)damage);
      return;
    }
    return;
  }
  _Var1 = suffix(s,"\'");
  if (!_Var1) {
    _Var1 = suffix(s,"!");
    if (!_Var1) {
      pcVar2 = ".";
      goto LAB_0017089d;
    }
  }
  pcVar2 = "";
LAB_0017089d:
  if ((damage < L'\x01') || ((p->opts).opt[3] != true)) {
    msgt(method->msgt,"%s %s%s",m_name,s,pcVar2);
  }
  else {
    msgt(method->msgt,"%s %s%s (%d)",m_name,s,pcVar2,(ulong)(uint)damage);
  }
  string_free(s);
  return;
}

Assistant:

static void display_blow_message_vs_player(const struct blow_method *method,
		const char *m_name, struct player *p, int damage)
{
	char *act = monster_blow_method_action(method, -1);

	if (act) {
		const char *fullstop = ".";

		if (suffix(act, "'") || suffix(act, "!")) {
			fullstop = "";
		}
		if (damage > 0 && OPT(p, show_damage)) {
			msgt(method->msgt, "%s %s%s (%d)", m_name, act,
				fullstop, damage);
		} else {
			msgt(method->msgt, "%s %s%s", m_name, act, fullstop);
		}
		string_free(act);
	} else if (damage > 0 && OPT(p, show_damage)) {
		msgt(method->msgt, "You take %d damage.", damage);
	}
}